

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O0

void lsvm::hashset::put(hashset *h,void *val)

{
  uint uVar1;
  int iVar2;
  equals_fp p_Var3;
  hashbucket **pphVar4;
  hashset *phVar5;
  ulong uVar6;
  entry *peVar7;
  hash_fp in_RSI;
  undefined8 *in_RDI;
  undefined1 unaff_retaddr;
  entry *ehe_1;
  entry *ehe;
  hash in_stack_00000018;
  uint32_t bs;
  entry *he;
  uint32_t index;
  uint32_t range;
  hashbucket *bp;
  uint16_t bit;
  hash keyhash;
  uint32_t in_stack_ffffffffffffffac;
  hashset *in_stack_ffffffffffffffb0;
  hashset *local_38;
  uint local_2c;
  hashbucket *local_28;
  
  p_Var3 = (equals_fp)(*(code *)in_RDI[1])(in_RSI);
  pphVar4 = partition(in_stack_ffffffffffffffb0,(uint16_t)(in_stack_ffffffffffffffac >> 0x10));
  local_28 = *pphVar4;
  do {
    if (local_28 == (hashbucket *)0x0) {
      insert_into_partition((hashset *)he,in_stack_00000018,ehe._6_2_,ehe_1,(bool)unaff_retaddr);
      return;
    }
    local_2c = ((uint)*(ushort *)((long)in_RDI + 0x1c) *
               *(int *)(primes + (ulong)local_28->bucket_size_indx * 4)) / 100000;
    iVar2 = (int)((ulong)p_Var3 % (ulong)*(uint *)(primes + (ulong)local_28->bucket_size_indx * 4));
    local_38 = (hashset *)
               get_entry((hashbucket *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    uVar1 = *(uint *)(primes + (ulong)local_28->bucket_size_indx * 4);
    if (uVar1 <= local_2c) {
      local_2c = uVar1 - 1;
    }
    if (iVar2 + local_2c < uVar1) {
      in_stack_ffffffffffffffb0 = (hashset *)(&local_38->equals + (ulong)local_2c * 2);
      for (; local_38 <= in_stack_ffffffffffffffb0; local_38 = (hashset *)&local_38->count) {
        if (((local_38->equals == p_Var3) && (local_38->hash != (hash_fp)0x0)) &&
           (uVar6 = (*(code *)*in_RDI)(in_RSI,local_38->hash), (uVar6 & 1) != 0)) {
          local_38->hash = in_RSI;
          return;
        }
      }
    }
    else {
      phVar5 = (hashset *)
               get_entry((hashbucket *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      for (; local_38 <= phVar5; local_38 = (hashset *)&local_38->count) {
        if (((local_38->equals == p_Var3) && (local_38->hash != (hash_fp)0x0)) &&
           (uVar6 = (*(code *)*in_RDI)(in_RSI,local_38->hash), (uVar6 & 1) != 0)) {
          local_38->hash = in_RSI;
          return;
        }
      }
      local_38 = (hashset *)
                 get_entry((hashbucket *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      peVar7 = (entry *)((long)local_38 + (ulong)((iVar2 + local_2c) - uVar1) * 0x10);
      for (; local_38 <= peVar7; local_38 = (hashset *)((long)local_38 + 0x10)) {
        if (((local_38->equals == p_Var3) && (local_38->hash != (hash_fp)0x0)) &&
           (uVar6 = (*(code *)*in_RDI)(in_RSI,local_38->hash), (uVar6 & 1) != 0)) {
          local_38->hash = in_RSI;
          return;
        }
      }
    }
    local_28 = local_28->next;
  } while( true );
}

Assistant:

void put(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *partition(h,bit);

    // find key in a bucket using open address and replace it's value
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he+range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    // if key not found insert it into partition
    insert_into_partition(h,keyhash,bit,val,true);
}